

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O3

MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::createSingleShaderProgram
          (MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           *__return_storage_ptr__,SeparateShaderTest *this,ShaderType shaderType,string *src)

{
  ostringstream *this_00;
  RenderContext *renderCtx;
  pointer pcVar1;
  deUint32 type;
  GLuint program;
  GLenum GVar2;
  qpShaderType type_00;
  ProgramWrapper *pPVar3;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  *pMVar4;
  TestLog *this_01;
  TestError *pTVar5;
  string *frgSource;
  char *srcStr;
  string local_270;
  long *local_250;
  long local_248;
  long local_240 [2];
  bool local_230;
  long *local_228 [2];
  long local_218 [2];
  pointer local_208;
  LogShader local_200;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  if ((this->m_params).useCreateHelper != true) {
    if (shaderType == SHADERTYPE_VERTEX) {
      frgSource = (string *)0x0;
    }
    else {
      frgSource = src;
      src = (string *)0x0;
    }
    pMVar4 = createShaderProgram(__return_storage_ptr__,this,src,frgSource,true);
    return pMVar4;
  }
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_208 = (src->_M_dataplus)._M_p;
  type = glu::getGLShaderType(shaderType);
  program = glu::CallLogWrapper::glCreateShaderProgramv
                      (&this->super_CallLogWrapper,type,1,&local_208);
  GVar2 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
  if ((program != 0) && (GVar2 == 0)) {
    pPVar3 = (ProgramWrapper *)operator_new(0x70);
    pPVar3->_vptr_ProgramWrapper = (_func_int **)&PTR__RawProgramWrapper_02157950;
    glu::Program::Program((Program *)(pPVar3 + 1),renderCtx,program);
    *(ShaderType *)&pPVar3[9]._vptr_ProgramWrapper = shaderType;
    pPVar3[10]._vptr_ProgramWrapper = (_func_int **)(pPVar3 + 0xc);
    pcVar1 = (src->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pPVar3 + 10),pcVar1,pcVar1 + src->_M_string_length);
    (__return_storage_ptr__->
    super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
    ).m_data.ptr = pPVar3;
    if (*(char *)&pPVar3[7]._vptr_ProgramWrapper != '\0') {
      return __return_storage_ptr__;
    }
    tcu::TestLog::writeMessage
              (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
               "glCreateShaderProgramv() failed at linking");
    (*pPVar3->_vptr_ProgramWrapper[3])
              (pPVar3,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"glCreateShaderProgram() failed at linking",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
               ,0x47b);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  type_00 = glu::getLogShaderType(shaderType);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"glCreateShaderProgramv() failed",0x1f);
  this_01 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_250 = local_240;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_250,"[glCreateShaderProgramv() failed]","");
  local_230 = false;
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_228,local_250,local_248 + (long)local_250);
  tcu::TestLog::startShaderProgram(this_01,local_230,(char *)local_228[0]);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_270,"[glCreateShaderProgramv() failed]","");
  tcu::LogShader::LogShader(&local_200,type_00,src,false,&local_270);
  tcu::TestLog::writeShader
            (this_01,local_200.m_type,local_200.m_source._M_dataplus._M_p,local_200.m_compileOk,
             local_200.m_infoLog._M_dataplus._M_p);
  tcu::TestLog::endShaderProgram(this_01);
  tcu::LogShader::~LogShader(&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if (local_228[0] != local_218) {
    operator_delete(local_228[0],local_218[0] + 1);
  }
  if (local_250 != local_240) {
    operator_delete(local_250,local_240[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar5,"glCreateShaderProgramv() failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
             ,0x46f);
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

MovePtr<ProgramWrapper> SeparateShaderTest::createSingleShaderProgram (ShaderType shaderType,
																	   const string& src)
{
	const RenderContext&	renderCtx	= getRenderContext();

	if (m_params.useCreateHelper)
	{
		const char*	const	srcStr		= src.c_str();
		const GLenum		glType		= glu::getGLShaderType(shaderType);
		const GLuint		programName	= glCreateShaderProgramv(glType, 1, &srcStr);

		if (glGetError() != GL_NO_ERROR || programName == 0)
		{
			qpShaderType qpType = glu::getLogShaderType(shaderType);

			log() << TestLog::Message << "glCreateShaderProgramv() failed"
				  << TestLog::EndMessage
				  << TestLog::ShaderProgram(false, "[glCreateShaderProgramv() failed]")
				  << TestLog::Shader(qpType, src,
									 false, "[glCreateShaderProgramv() failed]")
				  << TestLog::EndShaderProgram;
			TCU_FAIL("glCreateShaderProgramv() failed");
		}

		RawProgramWrapper* const	wrapper	= new RawProgramWrapper(renderCtx, programName,
																	shaderType, src);
		MovePtr<ProgramWrapper>		wrapperPtr(wrapper);
		Program&					program = wrapper->getProgram();

		if (!program.getLinkStatus())
		{
			log().writeMessage("glCreateShaderProgramv() failed at linking");
			wrapper->writeToLog(log());
			TCU_FAIL("glCreateShaderProgram() failed at linking");
		}
		return wrapperPtr;
	}
	else
	{
		switch (shaderType)
		{
			case glu::SHADERTYPE_VERTEX:
				return createShaderProgram(&src, DE_NULL, true);
			case glu::SHADERTYPE_FRAGMENT:
				return createShaderProgram(DE_NULL, &src, true);
			default:
				DE_FATAL("Impossible case");
		}
	}
	return MovePtr<ProgramWrapper>(); // Shut up compiler warnings.
}